

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O0

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   *B)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *in_RSI;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *in_RDI;
  const_iterator it;
  size_t i;
  key_type *in_stack_ffffffffffffffa8;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *this;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  vec_iterator<std::pair<unsigned_int,_double>_*,_true> local_28;
  vec_iterator<std::pair<unsigned_int,_double>_*,_true> local_20;
  ulong local_18;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *local_10;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::size(in_RDI);
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)in_RSI);
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar3 = std::
            vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            ::size(local_8);
    if (sVar3 <= uVar1) break;
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::operator[](local_8,local_18);
    boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::begin
              (in_stack_ffffffffffffffb8);
    while( true ) {
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::operator[](local_8,local_18);
      boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::end
                (in_stack_ffffffffffffffb8);
      bVar2 = boost::container::operator!=(&local_20,&local_28);
      if (!bVar2) break;
      ppVar4 = boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator->
                         (&local_20);
      in_stack_ffffffffffffffb8 =
           (flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *)ppVar4->second;
      this = local_10;
      ppVar4 = boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator->
                         (&local_20);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::operator[]((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    *)this,(ulong)ppVar4->first);
      pmVar5 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
               operator[](this,in_stack_ffffffffffffffa8);
      *pmVar5 = (mapped_type)in_stack_ffffffffffffffb8;
      boost::container::vec_iterator<std::pair<unsigned_int,_double>_*,_true>::operator++(&local_20)
      ;
    }
    local_18 = local_18 + 1;
  }
  do_nothing((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
              *)local_10);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}